

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Function * __thiscall wasm::TranslateToFuzzReader::addFunction(TranslateToFuzzReader *this)

{
  Random *this_00;
  HeapType *this_01;
  Module *pMVar1;
  iterator __position;
  pointer puVar2;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var3;
  uintptr_t uVar4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  __node_base_ptr p_Var10;
  TranslateToFuzzReader *pTVar11;
  char cVar12;
  uint32_t uVar13;
  Function *func;
  Type TVar14;
  Expression *pEVar15;
  uintptr_t *puVar16;
  size_t *psVar17;
  HeapType HVar18;
  uintptr_t extraout_RDX;
  Type this_02;
  iterator __end2;
  pointer ppEVar19;
  iterator __begin2;
  pointer ppEVar20;
  pointer puVar21;
  long lVar22;
  pointer ppEVar23;
  Name NVar24;
  Signature SVar25;
  string_view sVar26;
  undefined1 local_130 [8];
  FunctionCreationContext context;
  undefined1 auStack_a8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Function *local_80;
  pointer local_78;
  TranslateToFuzzReader *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> compatibleSegments;
  Type local_48;
  Type paramType;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_38;
  
  this_00 = &this->random;
  uVar13 = Random::upTo(this_00,100);
  paramType.id = (uintptr_t)this_00;
  uVar13 = Random::upTo(this_00,uVar13);
  this->LOGGING_PERCENT = uVar13;
  func = (Function *)operator_new(0x1d8);
  this_01 = &func->type;
  memset(func,0,0x1d8);
  wasm::HeapType::HeapType(this_01,(Signature)ZEXT816(0));
  func->profile = Normal;
  (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func->body = (Expression *)0x0;
  (func->localNames)._M_h._M_buckets = &(func->localNames)._M_h._M_single_bucket;
  (func->localNames)._M_h._M_bucket_count = 1;
  (func->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (func->localNames)._M_h._M_element_count = 0;
  (func->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (func->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (func->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (func->localIndices)._M_h._M_buckets = &(func->localIndices)._M_h._M_single_bucket;
  (func->localIndices)._M_h._M_bucket_count = 1;
  (func->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (func->localIndices)._M_h._M_element_count = 0;
  (func->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (func->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (func->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (func->debugLocations)._M_h._M_buckets = &(func->debugLocations)._M_h._M_single_bucket;
  (func->debugLocations)._M_h._M_bucket_count = 1;
  (func->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (func->debugLocations)._M_h._M_element_count = 0;
  (func->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (func->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (func->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (func->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  (func->epilogLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  (func->expressionLocations)._M_h._M_buckets = &(func->expressionLocations)._M_h._M_single_bucket;
  (func->expressionLocations)._M_h._M_bucket_count = 1;
  (func->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (func->expressionLocations)._M_h._M_element_count = 0;
  (func->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (func->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (func->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (func->delimiterLocations)._M_h._M_buckets = &(func->delimiterLocations)._M_h._M_single_bucket;
  (func->delimiterLocations)._M_h._M_bucket_count = 1;
  (func->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (func->delimiterLocations)._M_h._M_element_count = 0;
  (func->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(func->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
  (func->funcLocation).declarations = 0;
  (func->funcLocation).end = 0;
  (func->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (func->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (func->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (func->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  func->noFullInline = false;
  func->noPartialInline = false;
  pMVar1 = this->wasm;
  local_80 = func;
  local_70 = this;
  NVar24.super_IString.str = (IString)wasm::IString::interned(4,"func",0);
  sVar26 = (string_view)Names::getValidFunctionName(pMVar1,NVar24);
  TVar14 = paramType;
  pTVar11 = local_70;
  (func->super_Importable).super_Named.name.super_IString.str = sVar26;
  uVar13 = Random::upTo((Random *)paramType.id,(local_70->fuzzParams->super_FuzzParams).MAX_PARAMS);
  uVar13 = Random::upTo((Random *)TVar14.id,uVar13);
  auStack_a8 = (undefined1  [8])0x0;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8,(ulong)uVar13);
  if (uVar13 != 0) {
    do {
      local_130 = (undefined1  [8])getSingleConcreteType(pTVar11);
      if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_a8,
                   (iterator)
                   params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start,(Type *)local_130);
      }
      else {
        (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = (uintptr_t)local_130;
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  wasm::Type::Type(&local_48,auStack_a8);
  TVar14 = getControlFlowType(pTVar11);
  SVar25.results.id = TVar14.id;
  SVar25.params.id = local_48.id;
  wasm::HeapType::HeapType((HeapType *)local_130,SVar25);
  TVar14 = paramType;
  this_01->id = (uintptr_t)local_130;
  uVar13 = Random::upTo((Random *)paramType.id,(pTVar11->fuzzParams->super_FuzzParams).MAX_VARS);
  uVar13 = Random::upTo((Random *)TVar14.id,uVar13);
  if (uVar13 != 0) {
    do {
      local_130 = (undefined1  [8])getConcreteType(pTVar11);
      cVar12 = wasm::TypeUpdating::canHandleAsLocal((Type)local_130);
      if (cVar12 == '\0') {
        local_130 = (undefined1  [8])0x2;
      }
      __position._M_current =
           (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)&func->vars,__position,
                   (Type *)local_130);
      }
      else {
        (__position._M_current)->id = (uintptr_t)local_130;
        (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  FunctionCreationContext::FunctionCreationContext
            ((FunctionCreationContext *)local_130,pTVar11,func);
  wasm::HeapType::getSignature();
  uVar13 = Random::upTo((Random *)paramType.id,10);
  TVar14.id = extraout_RDX;
  if (uVar13 == 0) {
    TVar14.id = 1;
  }
  uVar13 = Random::upTo((Random *)paramType.id,2);
  if (uVar13 == 0) {
    pEVar15 = makeBlock(pTVar11,TVar14);
  }
  else {
    pEVar15 = make(pTVar11,TVar14);
  }
  func->body = pEVar15;
  wasm::Module::addFunction((unique_ptr *)pTVar11->wasm);
  local_78 = (pointer)Type::size(&local_48);
  context.typeLocals._M_h._M_single_bucket = (__node_base_ptr)func;
  if ((long)local_78 >> 2 < 1) {
    ppEVar19 = (pointer)0x0;
  }
  else {
    lVar22 = ((long)local_78 >> 2) + 1;
    ppEVar19 = (pointer)0x0;
    do {
      auStack_68 = (undefined1  [8])&local_48;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppEVar19;
      puVar16 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)auStack_68);
      local_38._M_head_impl = (ElementSegment *)*puVar16;
      cVar12 = wasm::Type::isDefaultable();
      ppEVar20 = ppEVar19;
      ppEVar23 = local_78;
      if (cVar12 == '\0') goto LAB_0013b682;
      auStack_68 = (undefined1  [8])&local_48;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((long)ppEVar19 + 1U);
      puVar16 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)auStack_68);
      local_38._M_head_impl = (ElementSegment *)*puVar16;
      cVar12 = wasm::Type::isDefaultable();
      ppEVar20 = (pointer)((long)ppEVar19 + 1U);
      ppEVar23 = local_78;
      if (cVar12 == '\0') goto LAB_0013b682;
      auStack_68 = (undefined1  [8])&local_48;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((long)ppEVar19 + 2U);
      puVar16 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)auStack_68);
      local_38._M_head_impl = (ElementSegment *)*puVar16;
      cVar12 = wasm::Type::isDefaultable();
      ppEVar20 = (pointer)((long)ppEVar19 + 2U);
      ppEVar23 = local_78;
      if (cVar12 == '\0') goto LAB_0013b682;
      auStack_68 = (undefined1  [8])&local_48;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((long)ppEVar19 + 3U);
      puVar16 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)auStack_68);
      local_38._M_head_impl = (ElementSegment *)*puVar16;
      cVar12 = wasm::Type::isDefaultable();
      ppEVar20 = (pointer)((long)ppEVar19 + 3U);
      ppEVar23 = local_78;
      if (cVar12 == '\0') goto LAB_0013b682;
      ppEVar19 = (pointer)((long)ppEVar19 + 4);
      lVar22 = lVar22 + -1;
    } while (1 < lVar22);
  }
  ppEVar23 = local_78;
  lVar22 = (long)local_78 - (long)ppEVar19;
  if (lVar22 == 1) {
LAB_0013b64a:
    auStack_68 = (undefined1  [8])&local_48;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppEVar19;
    puVar16 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)auStack_68);
    local_38._M_head_impl = (ElementSegment *)*puVar16;
    cVar12 = wasm::Type::isDefaultable();
    ppEVar20 = ppEVar19;
    if (cVar12 == '\0') goto LAB_0013b682;
  }
  else {
    if (lVar22 == 2) {
LAB_0013b620:
      auStack_68 = (undefined1  [8])&local_48;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppEVar19;
      puVar16 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)auStack_68);
      local_38._M_head_impl = (ElementSegment *)*puVar16;
      cVar12 = wasm::Type::isDefaultable();
      ppEVar20 = ppEVar19;
      if (cVar12 != '\0') {
        ppEVar19 = (pointer)((long)ppEVar19 + 1);
        goto LAB_0013b64a;
      }
    }
    else {
      if (lVar22 != 3) goto LAB_0013b687;
      auStack_68 = (undefined1  [8])&local_48;
      compatibleSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppEVar19;
      puVar16 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)auStack_68);
      local_38._M_head_impl = (ElementSegment *)*puVar16;
      cVar12 = wasm::Type::isDefaultable();
      ppEVar20 = ppEVar19;
      if (cVar12 != '\0') {
        ppEVar19 = (pointer)((long)ppEVar19 + 1);
        goto LAB_0013b620;
      }
    }
LAB_0013b682:
    if (ppEVar20 != ppEVar23) goto LAB_0013b707;
  }
LAB_0013b687:
  if ((((local_70->numAddedFunctions == 0) ||
       (uVar13 = Random::upTo((Random *)paramType.id,2), uVar13 == 0)) &&
      (NVar24.super_IString.str._M_str =
            (char *)(func->super_Importable).super_Named.name.super_IString.str._M_len,
      NVar24.super_IString.str._M_len = (size_t)local_70->wasm,
      lVar22 = wasm::Module::getExportOrNull(NVar24), lVar22 == 0)) &&
     (local_70->preserveImportsAndExports == false)) {
    pMVar1 = local_70->wasm;
    psVar17 = (size_t *)operator_new(0x30);
    sVar7 = (func->super_Importable).super_Named.name.super_IString.str._M_len;
    pcVar8 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
    pcVar9 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
    psVar17[3] = (func->super_Importable).super_Named.name.super_IString.str._M_len;
    psVar17[4] = (size_t)pcVar9;
    *psVar17 = sVar7;
    psVar17[1] = (size_t)pcVar8;
    *(undefined4 *)(psVar17 + 2) = 0;
    *(undefined1 *)(psVar17 + 5) = 0;
    wasm::Module::addExport((Export *)pMVar1);
  }
LAB_0013b707:
  while ((pTVar11 = local_70, p_Var10 = context.typeLocals._M_h._M_single_bucket,
         uVar13 = Random::upTo((Random *)paramType.id,3), uVar13 == 0 &&
         ((pTVar11->random).finishedInput == false))) {
    TVar14.id = this_01->id;
    if (((uint)(0x7c < TVar14.id) * 4 + 3 & (uint)TVar14.id) != 0) {
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
    auStack_68 = (undefined1  [8])0x0;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar21 = (pTVar11->wasm->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pTVar11->wasm->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_02 = paramType;
    if (puVar21 == puVar2) {
      uVar13 = 0;
    }
    else {
      do {
        _Var3._M_head_impl =
             (puVar21->_M_t).
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if ((*(char **)((long)&(_Var3._M_head_impl)->table + 8) != (char *)0x0) &&
           (local_38._M_head_impl = _Var3._M_head_impl,
           cVar12 = wasm::Type::isSubType(TVar14,(Type)((_Var3._M_head_impl)->type).id),
           this_02 = paramType, cVar12 != '\0')) {
          if (compatibleSegments.
              super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              compatibleSegments.
              super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<wasm::ElementSegment*,std::allocator<wasm::ElementSegment*>>::
            _M_realloc_insert<wasm::ElementSegment*const&>
                      ((vector<wasm::ElementSegment*,std::allocator<wasm::ElementSegment*>> *)
                       auStack_68,
                       (iterator)
                       compatibleSegments.
                       super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,&local_38._M_head_impl);
            this_02 = paramType;
          }
          else {
            *compatibleSegments.
             super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
             _M_impl.super__Vector_impl_data._M_start = _Var3._M_head_impl;
            compatibleSegments.
            super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 compatibleSegments.
                 super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        puVar21 = puVar21 + 1;
      } while (puVar21 != puVar2);
      uVar13 = (uint32_t)
               ((ulong)((long)compatibleSegments.
                              super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68) >> 3);
    }
    uVar13 = Random::upTo((Random *)this_02.id,uVar13);
    uVar4 = ((Type *)((long)auStack_68 + (ulong)uVar13 * 8))->id;
    p_Var5 = p_Var10->_M_nxt;
    p_Var6 = p_Var10[1]._M_nxt;
    HVar18.id = (uintptr_t)MixedArena::allocSpace(&((local_70->builder).wasm)->allocator,0x20,8);
    *(undefined1 *)HVar18.id = 0x2b;
    *(undefined8 *)(HVar18.id + 8) = 0;
    *(_Hash_node_base **)(HVar18.id + 0x10) = p_Var5;
    *(_Hash_node_base **)(HVar18.id + 0x18) = p_Var6;
    wasm::RefFunc::finalize(HVar18);
    local_38._M_head_impl = (ElementSegment *)HVar18.id;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)(uVar4 + 0x38),
               (Expression **)&local_38);
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)compatibleSegments.
                            super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
    }
  }
  pTVar11->numAddedFunctions = pTVar11->numAddedFunctions + 1;
  FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)local_130);
  if (auStack_a8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_a8,
                    (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)auStack_a8);
  }
  if (local_80 != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_80,local_80);
  }
  return (Function *)p_Var10;
}

Assistant:

Function* TranslateToFuzzReader::addFunction() {
  LOGGING_PERCENT = upToSquared(100);
  auto allocation = std::make_unique<Function>();
  auto* func = allocation.get();
  func->name = Names::getValidFunctionName(wasm, "func");
  Index numParams = upToSquared(fuzzParams->MAX_PARAMS);
  std::vector<Type> params;
  params.reserve(numParams);
  for (Index i = 0; i < numParams; i++) {
    auto type = getSingleConcreteType();
    params.push_back(type);
  }
  auto paramType = Type(params);
  auto resultType = getControlFlowType();
  func->type = Signature(paramType, resultType);
  Index numVars = upToSquared(fuzzParams->MAX_VARS);
  for (Index i = 0; i < numVars; i++) {
    auto type = getConcreteType();
    if (!TypeUpdating::canHandleAsLocal(type)) {
      type = Type::i32;
    }
    func->vars.push_back(type);
  }
  // Generate the function creation context after we filled in locals, which it
  // will scan.
  FunctionCreationContext context(*this, func);
  // with small chance, make the body unreachable
  auto bodyType = func->getResults();
  if (oneIn(10)) {
    bodyType = Type::unreachable;
  }
  // with reasonable chance make the body a block
  if (oneIn(2)) {
    func->body = makeBlock(bodyType);
  } else {
    func->body = make(bodyType);
  }

  // Add hang limit checks after all other operations on the function body.
  wasm.addFunction(std::move(allocation));
  // Export some functions, but not all (to allow inlining etc.). Try to export
  // at least one, though, to keep each testcase interesting. Avoid non-
  // nullable params, as those cannot be constructed by the fuzzer on the
  // outside.
  bool validExportParams =
    std::all_of(paramType.begin(), paramType.end(), [&](Type t) {
      return t.isDefaultable();
    });
  if (validExportParams && (numAddedFunctions == 0 || oneIn(2)) &&
      !wasm.getExportOrNull(func->name) && !preserveImportsAndExports) {
    wasm.addExport(new Export(func->name, ExternalKind::Function, func->name));
  }
  // add some to an elem segment
  while (oneIn(3) && !random.finished()) {
    auto type = Type(func->type, NonNullable);
    std::vector<ElementSegment*> compatibleSegments;
    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      if (Type::isSubType(type, segment->type)) {
        compatibleSegments.push_back(segment);
      }
    });
    auto& randomElem = compatibleSegments[upTo(compatibleSegments.size())];
    randomElem->data.push_back(builder.makeRefFunc(func->name, func->type));
  }
  numAddedFunctions++;
  return func;
}